

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::range_detail::indirected_range<std::vector<std::unique_ptr<signed_char,std::default_delete<signed_char>>,std::allocator<std::unique_ptr<signed_char,std::default_delete<signed_char>>>>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  initializer_list<int> *local_28;
  initializer_list<int> *rhs_local;
  char *op_local;
  indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
  *lhs_local;
  
  local_28 = (initializer_list<int> *)op;
  rhs_local = (initializer_list<int> *)lhs;
  op_local = (char *)this;
  lhs_local = (indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
               *)__return_storage_ptr__;
  toString<boost::range_detail::indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_true>
            (&local_58,
             (indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::initializer_list<int>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }